

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParserValidationErrorTest_ResolvedUndefinedOptionError_Test::TestBody
          (ParserValidationErrorTest_ResolvedUndefinedOptionError_Test *this)

{
  DescriptorPool *this_00;
  bool bVar1;
  FileDescriptor *pFVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar3;
  void *pvVar4;
  Arena *pAVar5;
  char *in_R9;
  pointer *__ptr;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view text;
  Metadata MVar6;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FileDescriptorProto other_file;
  FileDescriptorProto descriptor_proto;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_250;
  Message local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  undefined1 local_238 [8];
  VTable *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  AssertHelper local_218;
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  RepeatedPtrFieldBase local_1e0 [3];
  RepeatedPtrFieldBase local_198 [3];
  ArenaStringPtr local_148;
  ArenaStringPtr local_140 [5];
  FileDescriptorProto local_118;
  
  FileDescriptorProto::FileDescriptorProto(&local_118,(Arena *)0x0);
  MVar6 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  FileDescriptor::CopyTo((MVar6.descriptor)->file_,&local_118);
  this_00 = &(this->super_ParserValidationErrorTest).pool_;
  pFVar2 = DescriptorPool::BuildFile(this_00,&local_118);
  local_238[0] = (internal)(pFVar2 != (FileDescriptor *)0x0);
  local_230 = (VTable *)0x0;
  if (pFVar2 == (FileDescriptor *)0x0) {
    testing::Message::Message(&local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,(internal *)local_238,
               (AssertionResult *)"pool_.BuildFile(descriptor_proto) != nullptr","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xa29,(char *)local_210._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_250);
    if ((undefined1 *)local_210._0_8_ != local_200) {
      operator_delete((void *)local_210._0_8_,CONCAT71(local_200._1_7_,local_200[0]) + 1);
    }
    if ((long *)CONCAT71(local_248.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_248.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_248.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_248.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    if (local_230 != (VTable *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    }
LAB_00aad957:
    FileDescriptorProto::~FileDescriptorProto(&local_118);
    return;
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_210,(Arena *)0x0);
  local_200[0] = local_200[0] | 1;
  pAVar5 = (Arena *)local_210._8_8_;
  if ((local_210._8_8_ & 1) != 0) {
    pAVar5 = *(Arena **)(local_210._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "base2.proto";
  value._M_len = 0xb;
  protobuf::internal::ArenaStringPtr::Set(&local_148,value,pAVar5);
  local_200[0] = local_200[0] | 2;
  if ((local_210._8_8_ & 1) != 0) {
    local_210._8_8_ = *(undefined8 *)(local_210._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "baz";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set(local_140,value_00,(Arena *)local_210._8_8_);
  protobuf::internal::RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)(local_200 + 8));
  pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                     ((RepeatedPtrFieldBase *)(local_200 + 8),0);
  std::__cxx11::string::_M_assign((string *)pVVar3);
  pvVar4 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_1e0,Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
  pAVar5 = *(Arena **)((long)pvVar4 + 8);
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  value_01._M_str = "Bar";
  value_01._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar4 + 0xd8),value_01,pAVar5);
  pvVar4 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar4 + 0x18),
                      Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
  *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
  pAVar5 = *(Arena **)((long)pvVar4 + 8);
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  value_02._M_str = "foo";
  value_02._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar4 + 0x18),value_02,pAVar5);
  *(undefined4 *)((long)pvVar4 + 0x48) = 1;
  *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 0x40;
  bVar1 = protobuf::internal::ValidateEnum(1,(uint32_t *)&FieldDescriptorProto_Label_internal_data_)
  ;
  if (bVar1) {
    *(undefined4 *)((long)pvVar4 + 0x54) = 1;
    *(byte *)((long)pvVar4 + 0x11) = *(byte *)((long)pvVar4 + 0x11) | 2;
    bVar1 = protobuf::internal::ValidateEnum
                      (5,(uint32_t *)&FieldDescriptorProto_Type_internal_data_);
    if (bVar1) {
      *(undefined4 *)((long)pvVar4 + 0x58) = 5;
      *(byte *)((long)pvVar4 + 0x11) = *(byte *)((long)pvVar4 + 0x11) | 4;
      pvVar4 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                         (local_198,Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>)
      ;
      *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
      pAVar5 = *(Arena **)((long)pvVar4 + 8);
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      value_03._M_str = "bar";
      value_03._M_len = 3;
      protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)((long)pvVar4 + 0x18),value_03,pAVar5);
      *(undefined4 *)((long)pvVar4 + 0x48) = 0x7513b5;
      *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 0x40;
      bVar1 = protobuf::internal::ValidateEnum
                        (1,(uint32_t *)&FieldDescriptorProto_Label_internal_data_);
      if (!bVar1) goto LAB_00aad9c7;
      *(undefined4 *)((long)pvVar4 + 0x54) = 1;
      *(byte *)((long)pvVar4 + 0x11) = *(byte *)((long)pvVar4 + 0x11) | 2;
      bVar1 = protobuf::internal::ValidateEnum
                        (0xb,(uint32_t *)&FieldDescriptorProto_Type_internal_data_);
      if (bVar1) {
        *(undefined4 *)((long)pvVar4 + 0x58) = 0xb;
        *(uint *)((long)pvVar4 + 0x10) = *(uint *)((long)pvVar4 + 0x10) | 0x404;
        pAVar5 = *(Arena **)((long)pvVar4 + 8);
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        value_04._M_str = "Bar";
        value_04._M_len = 3;
        protobuf::internal::ArenaStringPtr::Set
                  ((ArenaStringPtr *)((long)pvVar4 + 0x28),value_04,pAVar5);
        *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 2;
        pAVar5 = *(Arena **)((long)pvVar4 + 8);
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        value_05._M_str = "google.protobuf.FileOptions";
        value_05._M_len = 0x1b;
        protobuf::internal::ArenaStringPtr::Set
                  ((ArenaStringPtr *)((long)pvVar4 + 0x20),value_05,pAVar5);
        pFVar2 = DescriptorPool::BuildFile(this_00,(FileDescriptorProto *)local_210);
        local_248.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ = (internal)(pFVar2 != (FileDescriptor *)0x0);
        local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_248.ss_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._0_1_) {
          testing::Message::Message((Message *)&local_250);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_238,(internal *)&local_248,
                     (AssertionResult *)"pool_.BuildFile(other_file) != nullptr","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_218,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                     ,0xa46,(char *)CONCAT71(local_238._1_7_,local_238[0]));
          testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_238._1_7_,local_238[0]) != &local_228) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_238._1_7_,local_238[0]),
                            local_228._M_allocated_capacity + 1);
          }
          if (local_250._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_250._M_head_impl + 8))();
          }
        }
        if (local_240 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_240,local_240);
        }
        testing::
        Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_238,
                "2:7: Option \"(baz.bar)\" is resolved to \"(qux.baz.bar)\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"(.baz.bar)\") to start from the outermost scope.\n"
               );
        text._M_str = "package qux.baz;\nimport \"base2.proto\";\noption (baz.bar).foo = 1;\n";
        text._M_len = 0x41;
        ParserTest::ExpectHasValidationErrors
                  (&this->super_ParserValidationErrorTest,text,
                   (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_238);
        testing::internal::
        MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_238);
        FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_210);
        goto LAB_00aad957;
      }
    }
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Type_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x3a52,
                  "void google::protobuf::FieldDescriptorProto::_internal_set_type(::google::protobuf::FieldDescriptorProto_Type)"
                 );
  }
LAB_00aad9c7:
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Label_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                ,0x3a33,
                "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
               );
}

Assistant:

TEST_F(ParserValidationErrorTest, ResolvedUndefinedOptionError) {
  // Build descriptor message in test pool
  FileDescriptorProto descriptor_proto;
  DescriptorProto::descriptor()->file()->CopyTo(&descriptor_proto);
  ASSERT_TRUE(pool_.BuildFile(descriptor_proto) != nullptr);

  // base2.proto:
  //   package baz
  //   import google/protobuf/descriptor.proto
  //   message Bar { optional int32 foo = 1; }
  //   extend FileOptions { optional Bar bar = 7672757; }
  FileDescriptorProto other_file;
  other_file.set_name("base2.proto");
  other_file.set_package("baz");
  other_file.add_dependency();
  other_file.set_dependency(0, descriptor_proto.name());

  DescriptorProto* message(other_file.add_message_type());
  message->set_name("Bar");
  FieldDescriptorProto* field(message->add_field());
  field->set_name("foo");
  field->set_number(1);
  field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  field->set_type(FieldDescriptorProto::TYPE_INT32);

  FieldDescriptorProto* extension(other_file.add_extension());
  extension->set_name("bar");
  extension->set_number(7672757);
  extension->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  extension->set_type(FieldDescriptorProto::TYPE_MESSAGE);
  extension->set_type_name("Bar");
  extension->set_extendee("google.protobuf.FileOptions");

  EXPECT_TRUE(pool_.BuildFile(other_file) != nullptr);

  // qux.proto:
  //   package qux.baz
  //   option (baz.bar).foo = 1;
  //
  // Although "baz.bar" is already defined, the lookup code will try
  // "qux.baz.bar", since it's the match from the innermost scope,
  // which will cause a symbol not defined error.
  ExpectHasValidationErrors(
      "package qux.baz;\n"
      "import \"base2.proto\";\n"
      "option (baz.bar).foo = 1;\n",
      "2:7: Option \"(baz.bar)\" is resolved to \"(qux.baz.bar)\","
      " which is not defined. The innermost scope is searched first "
      "in name resolution. Consider using a leading '.'(i.e., \"(.baz.bar)\")"
      " to start from the outermost scope.\n");
}